

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_bfins_mem_m68k
                   (CPUM68KState_conflict *env,uint32_t addr,uint32_t val,int32_t ofs,uint32_t len)

{
  uint64_t uVar1;
  byte bVar2;
  bf_data bVar3;
  uintptr_t unaff_retaddr;
  
  bVar3 = bf_prep(addr,ofs,len);
  uVar1 = bf_load(env,bVar3.addr,bVar3.blen,unaff_retaddr);
  bVar2 = -(char)bVar3.len;
  bf_store(env,bVar3.addr,bVar3.blen,
           ((ulong)val << (bVar2 & 0x3f)) >> ((byte)bVar3.bofs & 0x3f) |
           ~((ulong)(-1L << (bVar2 & 0x3f)) >> ((byte)bVar3.bofs & 0x3f)) & uVar1,unaff_retaddr);
  return val << (bVar2 & 0x1f);
}

Assistant:

uint32_t HELPER(bfins_mem)(CPUM68KState *env, uint32_t addr, uint32_t val,
                           int32_t ofs, uint32_t len)
{
    uintptr_t ra = GETPC();
    struct bf_data d = bf_prep(addr, ofs, len);
    uint64_t data = bf_load(env, d.addr, d.blen, ra);
#ifdef _MSC_VER
    uint64_t mask = 0xffffffffffffffffULL << (64 - d.len) >> d.bofs;
#else
    uint64_t mask = -1ull << (64 - d.len) >> d.bofs;
#endif

    data = (data & ~mask) | (((uint64_t)val << (64 - d.len)) >> d.bofs);

    bf_store(env, d.addr, d.blen, data, ra);

    /* The field at the top of the word is also CC_N for CC_OP_LOGIC.  */
    return val << (32 - d.len);
}